

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersector1<8,_1,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Scene *pSVar3;
  float **ppfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  RTCRayQueryContext *pRVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  byte bVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  Scene *scene;
  ulong uVar24;
  ulong uVar25;
  ulong unaff_R12;
  size_t mask;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar31 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [64];
  undefined4 uVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [64];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_2614;
  RTCIntersectArguments *local_2610;
  Geometry *local_2608;
  ulong local_2600;
  ulong local_25f8;
  ulong local_25f0;
  ulong local_25e8;
  ulong *local_25e0;
  RayQueryContext *local_25d8;
  ulong local_25d0;
  ulong local_25c8;
  ulong local_25c0;
  RTCFilterFunctionNArguments local_25b8;
  float local_2588;
  undefined4 local_2584;
  undefined4 local_2580;
  float local_257c;
  float local_2578;
  undefined4 local_2574;
  uint local_2570;
  uint local_256c;
  uint local_2568;
  undefined8 local_2558;
  undefined8 uStack_2550;
  undefined1 local_2548 [16];
  undefined1 local_2538 [16];
  undefined1 local_2528 [16];
  undefined1 local_2518 [16];
  byte local_2507;
  float local_24f8 [4];
  float local_24e8 [4];
  undefined1 local_24d8 [16];
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined8 local_2488;
  undefined8 uStack_2480;
  undefined1 local_2478 [32];
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  undefined1 local_23f8 [32];
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  undefined1 local_2398 [32];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
    local_2370[0] = 0;
    if (local_2378 != 8) {
      aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
      auVar31 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar29 = vandps_avx512vl((undefined1  [16])aVar2,auVar29);
      auVar41._8_4_ = 0x219392ef;
      auVar41._0_8_ = 0x219392ef219392ef;
      auVar41._12_4_ = 0x219392ef;
      uVar25 = vcmpps_avx512vl(auVar29,auVar41,1);
      bVar10 = (bool)((byte)uVar25 & 1);
      auVar42._0_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.x;
      bVar10 = (bool)((byte)(uVar25 >> 1) & 1);
      auVar42._4_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.y;
      bVar10 = (bool)((byte)(uVar25 >> 2) & 1);
      auVar42._8_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * (int)aVar2.z;
      bVar10 = (bool)((byte)(uVar25 >> 3) & 1);
      auVar42._12_4_ = (uint)bVar10 * 0x219392ef | (uint)!bVar10 * aVar2.field_3.a;
      auVar29 = vrcp14ps_avx512vl(auVar42);
      auVar30._8_4_ = 0x3f800000;
      auVar30._0_8_ = &DAT_3f8000003f800000;
      auVar30._12_4_ = 0x3f800000;
      auVar30 = vfnmadd213ps_avx512vl(auVar42,auVar29,auVar30);
      local_25e0 = local_2368;
      auVar42 = vfmadd132ps_fma(auVar30,auVar29,auVar29);
      auVar46 = vbroadcastss_avx512vl(auVar42);
      auVar70 = ZEXT3264(auVar46);
      auVar29 = vmovshdup_avx(auVar42);
      auVar46 = vbroadcastsd_avx512vl(auVar29);
      auVar71 = ZEXT3264(auVar46);
      auVar30 = vshufpd_avx(auVar42,auVar42,1);
      auVar63._8_4_ = 2;
      auVar63._0_8_ = 0x200000002;
      auVar63._12_4_ = 2;
      auVar63._16_4_ = 2;
      auVar63._20_4_ = 2;
      auVar63._24_4_ = 2;
      auVar63._28_4_ = 2;
      auVar46 = vpermps_avx512vl(auVar63,ZEXT1632(auVar42));
      auVar72 = ZEXT3264(auVar46);
      fVar54 = auVar42._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
      auVar52._4_4_ = fVar54;
      auVar52._0_4_ = fVar54;
      auVar52._8_4_ = fVar54;
      auVar52._12_4_ = fVar54;
      auVar52._16_4_ = fVar54;
      auVar52._20_4_ = fVar54;
      auVar52._24_4_ = fVar54;
      auVar52._28_4_ = fVar54;
      auVar46 = vbroadcastss_avx512vl(ZEXT416(1));
      auVar73 = ZEXT3264(auVar46);
      auVar48 = ZEXT1632(CONCAT412(auVar42._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3],
                                   CONCAT48(auVar42._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2]
                                            ,CONCAT44(auVar42._4_4_ *
                                                      (ray->super_RayK<1>).org.field_0.m128[1],
                                                      fVar54))));
      auVar47 = vpermps_avx512vl(auVar46,auVar48);
      auVar64 = ZEXT3264(auVar47);
      auVar46 = vpermps_avx2(auVar63,auVar48);
      local_25e8 = (ulong)(auVar42._0_4_ < 0.0) << 5;
      local_25f0 = (ulong)(auVar29._0_4_ < 0.0) << 5 | 0x40;
      uVar24 = (ulong)(auVar30._0_4_ < 0.0) << 5 | 0x80;
      uVar58 = auVar43._0_4_;
      auVar57 = ZEXT3264(CONCAT428(uVar58,CONCAT424(uVar58,CONCAT420(uVar58,CONCAT416(uVar58,
                                                  CONCAT412(uVar58,CONCAT48(uVar58,CONCAT44(uVar58,
                                                  uVar58))))))));
      auVar49._8_4_ = 0x80000000;
      auVar49._0_8_ = 0x8000000080000000;
      auVar49._12_4_ = 0x80000000;
      auVar49._16_4_ = 0x80000000;
      auVar49._20_4_ = 0x80000000;
      auVar49._24_4_ = 0x80000000;
      auVar49._28_4_ = 0x80000000;
      auVar48 = vxorps_avx512vl(auVar52,auVar49);
      auVar74 = ZEXT3264(auVar48);
      auVar47 = vxorps_avx512vl(auVar47,auVar49);
      auVar75 = ZEXT3264(auVar47);
      auVar46 = vxorps_avx512vl(auVar46,auVar49);
      auVar76 = ZEXT3264(auVar46);
      auVar46 = vbroadcastss_avx512vl(auVar31);
      auVar77 = ZEXT3264(auVar46);
      auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
      auVar78 = ZEXT3264(auVar46);
      auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
      auVar79 = ZEXT3264(auVar46);
      auVar31 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
      auVar80 = ZEXT1664(auVar31);
      auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
      auVar81 = ZEXT3264(auVar46);
      local_25c0 = uVar24;
      local_25c8 = local_25e8 ^ 0x20;
      local_25d0 = local_25f0 ^ 0x20;
      uVar25 = uVar24;
      uVar28 = local_25e8 ^ 0x20;
      local_25d8 = context;
      uVar22 = local_25f0 ^ 0x20;
      do {
        do {
          do {
            if (local_25e0 == &local_2378) {
              return;
            }
            pfVar5 = (float *)(local_25e0 + -1);
            local_25e0 = local_25e0 + -2;
          } while ((ray->super_RayK<1>).tfar < *pfVar5);
          uVar27 = *local_25e0;
          do {
            if ((uVar27 & 8) == 0) {
              auVar46 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + local_25e8),auVar74._0_32_
                                   ,auVar70._0_32_);
              auVar47 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + local_25f0),auVar75._0_32_
                                   ,auVar71._0_32_);
              auVar46 = vpmaxsd_avx2(auVar46,auVar47);
              auVar47 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + uVar25),auVar76._0_32_,
                                   auVar72._0_32_);
              auVar47 = vpmaxsd_avx512vl(auVar47,auVar77._0_32_);
              auVar46 = vpmaxsd_avx2(auVar46,auVar47);
              auVar64 = ZEXT3264(auVar46);
              auVar47 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + uVar28),auVar74._0_32_,
                                   auVar70._0_32_);
              auVar48 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + uVar22),auVar75._0_32_,
                                   auVar71._0_32_);
              auVar47 = vpminsd_avx2(auVar47,auVar48);
              auVar48 = vfmadd132ps_avx512vl
                                  (*(undefined1 (*) [32])(uVar27 + 0x40 + (uVar24 ^ 0x20)),
                                   auVar76._0_32_,auVar72._0_32_);
              auVar48 = vpminsd_avx2(auVar48,auVar57._0_32_);
              auVar47 = vpminsd_avx2(auVar47,auVar48);
              uVar15 = vpcmpd_avx512vl(auVar46,auVar47,2);
              unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),(uint)(byte)uVar15);
            }
            if ((uVar27 & 8) == 0) {
              if (unaff_R12 == 0) {
                iVar20 = 4;
              }
              else {
                auVar46 = *(undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0);
                auVar47 = ((undefined1 (*) [32])(uVar27 & 0xfffffffffffffff0))[1];
                auVar48 = vmovdqa64_avx512vl(auVar78._0_32_);
                auVar63 = auVar64._0_32_;
                auVar48 = vpternlogd_avx512vl(auVar48,auVar63,auVar79._0_32_,0xf8);
                uVar27 = unaff_R12 & 0xffffffff;
                auVar49 = vpcompressd_avx512vl(auVar48);
                bVar10 = (bool)((byte)uVar27 & 1);
                auVar51._0_4_ = (uint)bVar10 * auVar49._0_4_ | (uint)!bVar10 * auVar48._0_4_;
                bVar10 = (bool)((byte)(uVar27 >> 1) & 1);
                auVar51._4_4_ = (uint)bVar10 * auVar49._4_4_ | (uint)!bVar10 * auVar48._4_4_;
                bVar10 = (bool)((byte)(uVar27 >> 2) & 1);
                auVar51._8_4_ = (uint)bVar10 * auVar49._8_4_ | (uint)!bVar10 * auVar48._8_4_;
                bVar10 = (bool)((byte)(uVar27 >> 3) & 1);
                auVar51._12_4_ = (uint)bVar10 * auVar49._12_4_ | (uint)!bVar10 * auVar48._12_4_;
                bVar10 = (bool)((byte)(uVar27 >> 4) & 1);
                auVar51._16_4_ = (uint)bVar10 * auVar49._16_4_ | (uint)!bVar10 * auVar48._16_4_;
                bVar10 = (bool)((byte)(uVar27 >> 5) & 1);
                auVar51._20_4_ = (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * auVar48._20_4_;
                bVar10 = (bool)((byte)(uVar27 >> 6) & 1);
                auVar51._24_4_ = (uint)bVar10 * auVar49._24_4_ | (uint)!bVar10 * auVar48._24_4_;
                bVar10 = (bool)((byte)(uVar27 >> 7) & 1);
                auVar51._28_4_ = (uint)bVar10 * auVar49._28_4_ | (uint)!bVar10 * auVar48._28_4_;
                auVar48 = vpermt2q_avx512vl(auVar46,auVar51,auVar47);
                uVar27 = auVar48._0_8_;
                iVar20 = 0;
                uVar23 = unaff_R12 - 1 & unaff_R12;
                if (uVar23 != 0) {
                  auVar48 = vpshufd_avx2(auVar51,0x55);
                  vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                  auVar49 = vpminsd_avx2(auVar51,auVar48);
                  auVar48 = vpmaxsd_avx2(auVar51,auVar48);
                  uVar23 = uVar23 - 1 & uVar23;
                  if (uVar23 == 0) {
                    auVar49 = vpermi2q_avx512vl(auVar49,auVar46,auVar47);
                    uVar27 = auVar49._0_8_;
                    auVar46 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                    *local_25e0 = auVar46._0_8_;
                    auVar46 = vpermd_avx2(auVar48,auVar63);
                    *(int *)(local_25e0 + 1) = auVar46._0_4_;
                    local_25e0 = local_25e0 + 2;
                  }
                  else {
                    auVar53 = vpshufd_avx2(auVar51,0xaa);
                    vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                    auVar52 = vpminsd_avx2(auVar49,auVar53);
                    auVar49 = vpmaxsd_avx2(auVar49,auVar53);
                    auVar53 = vpminsd_avx2(auVar48,auVar49);
                    auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                    uVar23 = uVar23 - 1 & uVar23;
                    if (uVar23 == 0) {
                      auVar49 = vpermi2q_avx512vl(auVar52,auVar46,auVar47);
                      uVar27 = auVar49._0_8_;
                      auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                      *local_25e0 = auVar49._0_8_;
                      auVar48 = vpermd_avx2(auVar48,auVar63);
                      *(int *)(local_25e0 + 1) = auVar48._0_4_;
                      auVar46 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                      local_25e0[2] = auVar46._0_8_;
                      auVar46 = vpermd_avx2(auVar53,auVar63);
                      *(int *)(local_25e0 + 3) = auVar46._0_4_;
                      local_25e0 = local_25e0 + 4;
                    }
                    else {
                      auVar49 = vpshufd_avx2(auVar51,0xff);
                      vpermt2q_avx512vl(auVar46,auVar49,auVar47);
                      auVar11 = vpminsd_avx2(auVar52,auVar49);
                      auVar49 = vpmaxsd_avx2(auVar52,auVar49);
                      auVar52 = vpminsd_avx2(auVar53,auVar49);
                      auVar49 = vpmaxsd_avx2(auVar53,auVar49);
                      auVar53 = vpminsd_avx2(auVar48,auVar49);
                      auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                      uVar23 = uVar23 - 1 & uVar23;
                      iVar20 = 0;
                      if (uVar23 == 0) {
                        auVar49 = vpermi2q_avx512vl(auVar11,auVar46,auVar47);
                        uVar27 = auVar49._0_8_;
                        auVar49 = vpermt2q_avx512vl(auVar46,auVar48,auVar47);
                        *local_25e0 = auVar49._0_8_;
                        auVar64 = ZEXT3264(auVar63);
                        auVar48 = vpermd_avx2(auVar48,auVar63);
                        *(int *)(local_25e0 + 1) = auVar48._0_4_;
                        auVar48 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                        local_25e0[2] = auVar48._0_8_;
                        auVar48 = vpermd_avx2(auVar53,auVar63);
                        *(int *)(local_25e0 + 3) = auVar48._0_4_;
                        auVar46 = vpermt2q_avx512vl(auVar46,auVar52,auVar47);
                        local_25e0[4] = auVar46._0_8_;
                        auVar46 = vpermd_avx2(auVar52,auVar63);
                        *(int *)(local_25e0 + 5) = auVar46._0_4_;
                        local_25e0 = local_25e0 + 6;
                      }
                      else {
                        auVar50 = valignd_avx512vl(auVar51,auVar51,3);
                        auVar49 = vmovdqa64_avx512vl(auVar80._0_32_);
                        auVar51 = vpermt2d_avx512vl(auVar49,auVar81._0_32_,auVar11);
                        auVar49 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                        auVar52 = vpermt2d_avx512vl(auVar51,auVar49,auVar52);
                        auVar52 = vpermt2d_avx512vl(auVar52,auVar49,auVar53);
                        auVar49 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                        auVar48 = vpermt2d_avx512vl(auVar52,auVar49,auVar48);
                        auVar64 = ZEXT3264(auVar48);
                        uVar27 = uVar23;
                        do {
                          auVar49 = auVar64._0_32_;
                          auVar48 = vpermps_avx512vl(auVar73._0_32_,auVar50);
                          auVar50 = valignd_avx512vl(auVar50,auVar50,1);
                          vpermt2q_avx512vl(auVar46,auVar50,auVar47);
                          uVar27 = uVar27 - 1 & uVar27;
                          uVar15 = vpcmpd_avx512vl(auVar48,auVar49,5);
                          auVar48 = vpmaxsd_avx2(auVar48,auVar49);
                          bVar19 = (byte)uVar15 << 1;
                          auVar49 = valignd_avx512vl(auVar49,auVar49,7);
                          bVar10 = (bool)((byte)uVar15 & 1);
                          auVar53._4_4_ =
                               (uint)bVar10 * auVar49._4_4_ | (uint)!bVar10 * auVar48._4_4_;
                          auVar53._0_4_ = auVar48._0_4_;
                          bVar10 = (bool)(bVar19 >> 2 & 1);
                          auVar53._8_4_ =
                               (uint)bVar10 * auVar49._8_4_ | (uint)!bVar10 * auVar48._8_4_;
                          bVar10 = (bool)(bVar19 >> 3 & 1);
                          auVar53._12_4_ =
                               (uint)bVar10 * auVar49._12_4_ | (uint)!bVar10 * auVar48._12_4_;
                          bVar10 = (bool)(bVar19 >> 4 & 1);
                          auVar53._16_4_ =
                               (uint)bVar10 * auVar49._16_4_ | (uint)!bVar10 * auVar48._16_4_;
                          bVar10 = (bool)(bVar19 >> 5 & 1);
                          auVar53._20_4_ =
                               (uint)bVar10 * auVar49._20_4_ | (uint)!bVar10 * auVar48._20_4_;
                          bVar10 = (bool)(bVar19 >> 6 & 1);
                          auVar53._24_4_ =
                               (uint)bVar10 * auVar49._24_4_ | (uint)!bVar10 * auVar48._24_4_;
                          auVar53._28_4_ =
                               (uint)(bVar19 >> 7) * auVar49._28_4_ |
                               (uint)!(bool)(bVar19 >> 7) * auVar48._28_4_;
                          auVar64 = ZEXT3264(auVar53);
                        } while (uVar27 != 0);
                        lVar26 = POPCOUNT(uVar23) + 3;
                        do {
                          auVar48 = vpermi2q_avx512vl(auVar53,auVar46,auVar47);
                          *local_25e0 = auVar48._0_8_;
                          auVar49 = auVar64._0_32_;
                          auVar48 = vpermd_avx2(auVar49,auVar63);
                          *(int *)(local_25e0 + 1) = auVar48._0_4_;
                          auVar53 = valignd_avx512vl(auVar49,auVar49,1);
                          local_25e0 = local_25e0 + 2;
                          auVar64 = ZEXT3264(auVar53);
                          lVar26 = lVar26 + -1;
                        } while (lVar26 != 0);
                        auVar46 = vpermt2q_avx512vl(auVar46,auVar53,auVar47);
                        uVar27 = auVar46._0_8_;
                        auVar64 = ZEXT3264(auVar63);
                      }
                    }
                  }
                }
              }
            }
            else {
              iVar20 = 6;
            }
          } while (iVar20 == 0);
        } while (iVar20 != 6);
        local_2398 = auVar64._0_32_;
        uVar25 = (ulong)((uint)uVar27 & 0xf);
        if (uVar25 != 8) {
          uVar27 = uVar27 & 0xfffffffffffffff0;
          pSVar3 = local_25d8->scene;
          lVar26 = 0;
          do {
            lVar21 = lVar26 * 0x50;
            ppfVar4 = (pSVar3->vertices).items;
            pfVar5 = ppfVar4[*(uint *)(uVar27 + 0x30 + lVar21)];
            pfVar6 = ppfVar4[*(uint *)(uVar27 + 0x34 + lVar21)];
            pfVar7 = ppfVar4[*(uint *)(uVar27 + 0x38 + lVar21)];
            pfVar8 = ppfVar4[*(uint *)(uVar27 + 0x3c + lVar21)];
            auVar29 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + lVar21)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 8 + lVar21)))
            ;
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar5 + *(uint *)(uVar27 + lVar21)),
                                    *(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar27 + 8 + lVar21)))
            ;
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 4 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0xc + lVar21)));
            auVar43 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar6 + *(uint *)(uVar27 + 4 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0xc + lVar21)));
            auVar36 = vunpcklps_avx(auVar31,auVar43);
            auVar34 = vunpcklps_avx(auVar29,auVar30);
            auVar35 = vunpckhps_avx(auVar29,auVar30);
            auVar29 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x10 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x18 + lVar21)));
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x10 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x18 + lVar21)));
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x14 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x1c + lVar21)));
            auVar43 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x14 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x1c + lVar21)));
            auVar41 = vunpcklps_avx(auVar31,auVar43);
            auVar33 = vunpcklps_avx(auVar29,auVar30);
            auVar43 = vunpckhps_avx(auVar29,auVar30);
            auVar30 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x20 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x28 + lVar21)));
            auVar31 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar5 + *(uint *)(uVar27 + 0x20 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar7 + *(uint *)(uVar27 + 0x28 + lVar21)));
            auVar42 = vunpcklps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x24 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x2c + lVar21)));
            auVar29 = vunpckhps_avx(*(undefined1 (*) [16])
                                     (pfVar6 + *(uint *)(uVar27 + 0x24 + lVar21)),
                                    *(undefined1 (*) [16])
                                     (pfVar8 + *(uint *)(uVar27 + 0x2c + lVar21)));
            auVar32 = vunpcklps_avx(auVar31,auVar29);
            auVar37 = vunpcklps_avx(auVar30,auVar42);
            puVar1 = (undefined8 *)(uVar27 + 0x30 + lVar21);
            local_2488 = *puVar1;
            uStack_2480 = puVar1[1];
            auVar42 = vunpckhps_avx(auVar30,auVar42);
            puVar1 = (undefined8 *)(uVar27 + 0x40 + lVar21);
            local_2558 = *puVar1;
            uStack_2550 = puVar1[1];
            auVar31 = vsubps_avx(auVar34,auVar33);
            auVar43 = vsubps_avx(auVar35,auVar43);
            auVar29 = vsubps_avx(auVar36,auVar41);
            auVar30 = vsubps_avx(auVar37,auVar34);
            auVar42 = vsubps_avx(auVar42,auVar35);
            auVar41 = vsubps_avx(auVar32,auVar36);
            auVar37._0_4_ = auVar43._0_4_ * auVar41._0_4_;
            auVar37._4_4_ = auVar43._4_4_ * auVar41._4_4_;
            auVar37._8_4_ = auVar43._8_4_ * auVar41._8_4_;
            auVar37._12_4_ = auVar43._12_4_ * auVar41._12_4_;
            local_24c8 = vfmsub231ps_fma(auVar37,auVar42,auVar29);
            auVar38._0_4_ = auVar29._0_4_ * auVar30._0_4_;
            auVar38._4_4_ = auVar29._4_4_ * auVar30._4_4_;
            auVar38._8_4_ = auVar29._8_4_ * auVar30._8_4_;
            auVar38._12_4_ = auVar29._12_4_ * auVar30._12_4_;
            local_24b8 = vfmsub231ps_fma(auVar38,auVar41,auVar31);
            auVar39._0_4_ = auVar31._0_4_ * auVar42._0_4_;
            auVar39._4_4_ = auVar31._4_4_ * auVar42._4_4_;
            auVar39._8_4_ = auVar31._8_4_ * auVar42._8_4_;
            auVar39._12_4_ = auVar31._12_4_ * auVar42._12_4_;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar40._4_4_ = uVar58;
            auVar40._0_4_ = uVar58;
            auVar40._8_4_ = uVar58;
            auVar40._12_4_ = uVar58;
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar69._4_4_ = uVar58;
            auVar69._0_4_ = uVar58;
            auVar69._8_4_ = uVar58;
            auVar69._12_4_ = uVar58;
            auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar58 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar33._4_4_ = uVar58;
            auVar33._0_4_ = uVar58;
            auVar33._8_4_ = uVar58;
            auVar33._12_4_ = uVar58;
            auVar33 = vsubps_avx512vl(auVar34,auVar33);
            local_24a8 = vfmsub231ps_fma(auVar39,auVar30,auVar43);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar34._4_4_ = uVar58;
            auVar34._0_4_ = uVar58;
            auVar34._8_4_ = uVar58;
            auVar34._12_4_ = uVar58;
            auVar34 = vsubps_avx512vl(auVar35,auVar34);
            uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar35._4_4_ = uVar58;
            auVar35._0_4_ = uVar58;
            auVar35._8_4_ = uVar58;
            auVar35._12_4_ = uVar58;
            auVar35 = vsubps_avx512vl(auVar36,auVar35);
            auVar36 = vmulps_avx512vl(auVar69,auVar35);
            auVar37 = vfmsub231ps_avx512vl(auVar36,auVar34,auVar32);
            auVar36 = vmulps_avx512vl(auVar32,auVar33);
            auVar38 = vfmsub231ps_avx512vl(auVar36,auVar35,auVar40);
            auVar36 = vmulps_avx512vl(auVar40,auVar34);
            auVar39 = vfmsub231ps_avx512vl(auVar36,auVar33,auVar69);
            auVar36 = vmulps_avx512vl(local_24a8,auVar32);
            auVar36 = vfmadd231ps_avx512vl(auVar36,local_24b8,auVar69);
            auVar40 = vfmadd231ps_avx512vl(auVar36,local_24c8,auVar40);
            auVar36._8_4_ = 0x7fffffff;
            auVar36._0_8_ = 0x7fffffff7fffffff;
            auVar36._12_4_ = 0x7fffffff;
            local_2518 = vandps_avx512vl(auVar40,auVar36);
            auVar41 = vmulps_avx512vl(auVar41,auVar39);
            auVar42 = vfmadd231ps_avx512vl(auVar41,auVar38,auVar42);
            auVar30 = vfmadd231ps_avx512vl(auVar42,auVar37,auVar30);
            auVar32._8_4_ = 0x80000000;
            auVar32._0_8_ = 0x8000000080000000;
            auVar32._12_4_ = 0x80000000;
            auVar42 = vandpd_avx512vl(auVar40,auVar32);
            uVar65 = auVar42._0_4_;
            local_2548._0_4_ = (float)(uVar65 ^ auVar30._0_4_);
            uVar66 = auVar42._4_4_;
            local_2548._4_4_ = (float)(uVar66 ^ auVar30._4_4_);
            uVar67 = auVar42._8_4_;
            local_2548._8_4_ = (float)(uVar67 ^ auVar30._8_4_);
            uVar68 = auVar42._12_4_;
            local_2548._12_4_ = (float)(uVar68 ^ auVar30._12_4_);
            auVar29 = vmulps_avx512vl(auVar29,auVar39);
            auVar43 = vfmadd231ps_avx512vl(auVar29,auVar43,auVar38);
            auVar31 = vfmadd231ps_avx512vl(auVar43,auVar31,auVar37);
            local_2538._0_4_ = (float)(uVar65 ^ auVar31._0_4_);
            local_2538._4_4_ = (float)(uVar66 ^ auVar31._4_4_);
            local_2538._8_4_ = (float)(uVar67 ^ auVar31._8_4_);
            local_2538._12_4_ = (float)(uVar68 ^ auVar31._12_4_);
            auVar31 = ZEXT816(0) << 0x40;
            uVar15 = vcmpps_avx512vl(local_2548,auVar31,5);
            uVar12 = vcmpps_avx512vl(local_2538,auVar31,5);
            uVar13 = vcmpps_avx512vl(auVar40,auVar31,4);
            auVar31._0_4_ = local_2538._0_4_ + local_2548._0_4_;
            auVar31._4_4_ = local_2538._4_4_ + local_2548._4_4_;
            auVar31._8_4_ = local_2538._8_4_ + local_2548._8_4_;
            auVar31._12_4_ = local_2538._12_4_ + local_2548._12_4_;
            uVar14 = vcmpps_avx512vl(auVar31,local_2518,2);
            local_2507 = (byte)uVar15 & (byte)uVar12 & (byte)uVar13 & (byte)uVar14;
            if (local_2507 != 0) {
              auVar62._0_4_ = local_24a8._0_4_ * auVar35._0_4_;
              auVar62._4_4_ = local_24a8._4_4_ * auVar35._4_4_;
              auVar62._8_4_ = local_24a8._8_4_ * auVar35._8_4_;
              auVar62._12_4_ = local_24a8._12_4_ * auVar35._12_4_;
              auVar31 = vfmadd213ps_fma(auVar34,local_24b8,auVar62);
              auVar31 = vfmadd213ps_fma(auVar33,local_24c8,auVar31);
              local_2528._0_4_ = (float)(uVar65 ^ auVar31._0_4_);
              local_2528._4_4_ = (float)(uVar66 ^ auVar31._4_4_);
              local_2528._8_4_ = (float)(uVar67 ^ auVar31._8_4_);
              local_2528._12_4_ = (float)(uVar68 ^ auVar31._12_4_);
              uVar58 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar43._4_4_ = uVar58;
              auVar43._0_4_ = uVar58;
              auVar43._8_4_ = uVar58;
              auVar43._12_4_ = uVar58;
              auVar31 = vmulps_avx512vl(local_2518,auVar43);
              fVar54 = (ray->super_RayK<1>).tfar;
              auVar16._4_4_ = fVar54;
              auVar16._0_4_ = fVar54;
              auVar16._8_4_ = fVar54;
              auVar16._12_4_ = fVar54;
              auVar43 = vmulps_avx512vl(local_2518,auVar16);
              uVar15 = vcmpps_avx512vl(local_2528,auVar43,2);
              uVar12 = vcmpps_avx512vl(auVar31,local_2528,1);
              local_2507 = (byte)uVar15 & (byte)uVar12 & local_2507;
              uVar28 = (ulong)local_2507;
              if (local_2507 != 0) {
                auVar31 = vrcp14ps_avx512vl(local_2518);
                auVar17._8_4_ = 0x3f800000;
                auVar17._0_8_ = &DAT_3f8000003f800000;
                auVar17._12_4_ = 0x3f800000;
                auVar43 = vfnmadd213ps_avx512vl(local_2518,auVar31,auVar17);
                auVar31 = vfmadd132ps_fma(auVar43,auVar31,auVar31);
                fVar54 = auVar31._0_4_;
                local_24d8._0_4_ = fVar54 * local_2528._0_4_;
                fVar59 = auVar31._4_4_;
                local_24d8._4_4_ = fVar59 * local_2528._4_4_;
                fVar60 = auVar31._8_4_;
                local_24d8._8_4_ = fVar60 * local_2528._8_4_;
                fVar61 = auVar31._12_4_;
                local_24d8._12_4_ = fVar61 * local_2528._12_4_;
                auVar57 = ZEXT1664(local_24d8);
                local_24f8[0] = fVar54 * local_2548._0_4_;
                local_24f8[1] = fVar59 * local_2548._4_4_;
                local_24f8[2] = fVar60 * local_2548._8_4_;
                local_24f8[3] = fVar61 * local_2548._12_4_;
                local_24e8[0] = fVar54 * local_2538._0_4_;
                local_24e8[1] = fVar59 * local_2538._4_4_;
                local_24e8[2] = fVar60 * local_2538._8_4_;
                local_24e8[3] = fVar61 * local_2538._12_4_;
                auVar55._8_4_ = 0x7f800000;
                auVar55._0_8_ = 0x7f8000007f800000;
                auVar55._12_4_ = 0x7f800000;
                auVar31 = vblendmps_avx512vl(auVar55,local_24d8);
                auVar44._0_4_ =
                     (uint)(local_2507 & 1) * auVar31._0_4_ |
                     (uint)!(bool)(local_2507 & 1) * 0x7f800000;
                bVar10 = (bool)(local_2507 >> 1 & 1);
                auVar44._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_2507 >> 2 & 1);
                auVar44._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * 0x7f800000;
                bVar10 = (bool)(local_2507 >> 3 & 1);
                auVar44._12_4_ = (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * 0x7f800000;
                auVar31 = vshufps_avx(auVar44,auVar44,0xb1);
                auVar31 = vminps_avx(auVar31,auVar44);
                auVar43 = vshufpd_avx(auVar31,auVar31,1);
                auVar31 = vminps_avx(auVar43,auVar31);
                uVar15 = vcmpps_avx512vl(auVar44,auVar31,0);
                bVar19 = (byte)uVar15 & local_2507;
                if (((byte)uVar15 & local_2507) == 0) {
                  bVar19 = local_2507;
                }
                local_25f8 = 0;
                for (uVar22 = (ulong)bVar19; (uVar22 & 1) == 0;
                    uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                  local_25f8 = local_25f8 + 1;
                }
                do {
                  local_2570 = *(uint *)((long)&local_2488 + local_25f8 * 4);
                  local_2608 = (pSVar3->geometries).items[local_2570].ptr;
                  if ((local_2608->mask & (ray->super_RayK<1>).mask) == 0) {
                    uVar28 = (ulong)(byte)(~(byte)(1 << ((uint)local_25f8 & 0x1f)) & (byte)uVar28);
                    bVar10 = true;
                  }
                  else if ((local_25d8->args->filter == (RTCFilterFunctionN)0x0) &&
                          (local_2608->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    bVar10 = false;
                  }
                  else {
                    local_2610 = local_25d8->args;
                    local_2498 = auVar57._0_16_;
                    local_2478 = auVar77._0_32_;
                    local_2458 = auVar76._0_32_;
                    local_2438 = auVar75._0_32_;
                    local_2418 = auVar74._0_32_;
                    local_23f8 = auVar72._0_32_;
                    local_23d8 = auVar71._0_32_;
                    local_23b8 = auVar70._0_32_;
                    local_25b8.context = local_25d8->user;
                    local_2588 = *(float *)(local_24c8 + local_25f8 * 4);
                    local_2584 = *(undefined4 *)(local_24b8 + local_25f8 * 4);
                    local_2580 = *(undefined4 *)(local_24a8 + local_25f8 * 4);
                    local_257c = local_24f8[local_25f8];
                    local_2578 = local_24e8[local_25f8];
                    local_2574 = *(undefined4 *)((long)&local_2558 + local_25f8 * 4);
                    local_2600 = (ulong)local_2570;
                    local_256c = (local_25b8.context)->instID[0];
                    local_2568 = (local_25b8.context)->instPrimID[0];
                    fVar54 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_24d8 + local_25f8 * 4);
                    local_2614 = -1;
                    local_25b8.valid = &local_2614;
                    local_25b8.geometryUserPtr = local_2608->userPtr;
                    local_25b8.ray = (RTCRayN *)ray;
                    local_25b8.hit = (RTCHitN *)&local_2588;
                    local_25b8.N = 1;
                    if ((local_2608->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                       ((*local_2608->intersectionFilterN)(&local_25b8), *local_25b8.valid != 0)) {
                      if (local_2610->filter != (RTCFilterFunctionN)0x0) {
                        if (((local_2610->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((local_2608->field_8).field_0x2 & 0x40) != 0)) {
                          (*local_2610->filter)(&local_25b8);
                        }
                        if (*local_25b8.valid == 0) goto LAB_01fbb33c;
                      }
                      (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25b8.hit;
                      (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25b8.hit + 4);
                      (((Vec3f *)((long)local_25b8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25b8.hit + 8);
                      *(float *)((long)local_25b8.ray + 0x3c) = *(float *)(local_25b8.hit + 0xc);
                      *(float *)((long)local_25b8.ray + 0x40) = *(float *)(local_25b8.hit + 0x10);
                      *(float *)((long)local_25b8.ray + 0x44) = *(float *)(local_25b8.hit + 0x14);
                      *(float *)((long)local_25b8.ray + 0x48) = *(float *)(local_25b8.hit + 0x18);
                      *(float *)((long)local_25b8.ray + 0x4c) = *(float *)(local_25b8.hit + 0x1c);
                      *(float *)((long)local_25b8.ray + 0x50) = *(float *)(local_25b8.hit + 0x20);
                    }
                    else {
LAB_01fbb33c:
                      (ray->super_RayK<1>).tfar = fVar54;
                    }
                    auVar57 = ZEXT1664(local_2498);
                    fVar54 = (ray->super_RayK<1>).tfar;
                    auVar18._4_4_ = fVar54;
                    auVar18._0_4_ = fVar54;
                    auVar18._8_4_ = fVar54;
                    auVar18._12_4_ = fVar54;
                    uVar15 = vcmpps_avx512vl(local_2498,auVar18,2);
                    uVar28 = (ulong)(byte)(~(byte)(1 << ((uint)local_25f8 & 0x1f)) & (byte)uVar28 &
                                          (byte)uVar15);
                    bVar10 = true;
                    auVar70 = ZEXT3264(local_23b8);
                    auVar71 = ZEXT3264(local_23d8);
                    auVar72 = ZEXT3264(local_23f8);
                    auVar46 = vbroadcastss_avx512vl(ZEXT416(1));
                    auVar73 = ZEXT3264(auVar46);
                    auVar74 = ZEXT3264(local_2418);
                    auVar75 = ZEXT3264(local_2438);
                    auVar76 = ZEXT3264(local_2458);
                    auVar77 = ZEXT3264(local_2478);
                    auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
                    auVar78 = ZEXT3264(auVar46);
                    auVar46 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
                    auVar79 = ZEXT3264(auVar46);
                    auVar31 = vpbroadcastd_avx512vl(ZEXT416(0x80000000));
                    auVar80 = ZEXT1664(auVar31);
                    auVar46 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                    auVar81 = ZEXT3264(auVar46);
                    local_2570 = (uint)local_2600;
                  }
                  if (!bVar10) {
                    fVar54 = local_24f8[local_25f8];
                    fVar59 = local_24e8[local_25f8];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24d8 + local_25f8 * 4);
                    (ray->Ng).field_0.field_0.x = *(float *)(local_24c8 + local_25f8 * 4);
                    (ray->Ng).field_0.field_0.y = *(float *)(local_24b8 + local_25f8 * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)(local_24a8 + local_25f8 * 4);
                    ray->u = fVar54;
                    ray->v = fVar59;
                    ray->primID = *(uint *)((long)&local_2558 + local_25f8 * 4);
                    ray->geomID = local_2570;
                    pRVar9 = local_25d8->user;
                    ray->instID[0] = pRVar9->instID[0];
                    ray->instPrimID[0] = pRVar9->instPrimID[0];
                    break;
                  }
                  bVar19 = (byte)uVar28;
                  if (bVar19 == 0) break;
                  auVar56._8_4_ = 0x7f800000;
                  auVar56._0_8_ = 0x7f8000007f800000;
                  auVar56._12_4_ = 0x7f800000;
                  auVar31 = vblendmps_avx512vl(auVar56,auVar57._0_16_);
                  auVar45._0_4_ =
                       (uint)(bVar19 & 1) * auVar31._0_4_ | (uint)!(bool)(bVar19 & 1) * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar28 >> 1) & 1);
                  auVar45._4_4_ = (uint)bVar10 * auVar31._4_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                  auVar45._8_4_ = (uint)bVar10 * auVar31._8_4_ | (uint)!bVar10 * 0x7f800000;
                  bVar10 = (bool)((byte)(uVar28 >> 3) & 1);
                  auVar45._12_4_ = (uint)bVar10 * auVar31._12_4_ | (uint)!bVar10 * 0x7f800000;
                  auVar31 = vshufps_avx(auVar45,auVar45,0xb1);
                  auVar31 = vminps_avx(auVar31,auVar45);
                  auVar43 = vshufpd_avx(auVar31,auVar31,1);
                  auVar31 = vminps_avx(auVar43,auVar31);
                  uVar15 = vcmpps_avx512vl(auVar45,auVar31,0);
                  bVar19 = (byte)uVar15 & bVar19;
                  uVar65 = (uint)uVar28;
                  if (bVar19 != 0) {
                    uVar65 = (uint)bVar19;
                  }
                  uVar66 = 0;
                  for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                    uVar66 = uVar66 + 1;
                  }
                  local_25f8 = (ulong)uVar66;
                } while( true );
              }
            }
            lVar26 = lVar26 + 1;
          } while (lVar26 != uVar25 - 8);
        }
        fVar54 = (ray->super_RayK<1>).tfar;
        auVar57 = ZEXT3264(CONCAT428(fVar54,CONCAT424(fVar54,CONCAT420(fVar54,CONCAT416(fVar54,
                                                  CONCAT412(fVar54,CONCAT48(fVar54,CONCAT44(fVar54,
                                                  fVar54))))))));
        auVar64 = ZEXT3264(local_2398);
        uVar25 = local_25c0;
        uVar28 = local_25c8;
        uVar22 = local_25d0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }